

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

void __thiscall cmFindBase::StoreFindResult(cmFindBase *this,string *value)

{
  cmMakefile *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  PolicyStatus PVar4;
  ulong uVar5;
  string_view sVar6;
  char (*local_168) [6];
  string_view local_f0;
  string_view local_e0;
  string local_d0;
  string local_b0;
  string_view local_90;
  string_view local_80;
  undefined1 local_60 [8];
  string notFound;
  bool updateNormalVariable;
  bool force;
  string *value_local;
  cmFindBase *this_local;
  
  PVar3 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0125,false);
  PVar4 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0126,false);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    if ((this->StoreResultInCache & 1U) == 0) {
      pcVar1 = (this->super_cmFindCommon).Makefile;
      sVar6 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)value)
      ;
      notFound.field_2._8_8_ = sVar6._M_len;
      cmMakefile::AddDefinition(pcVar1,&this->VariableName,sVar6);
      return;
    }
    cmMakefile::AddCacheDefinition
              ((this->super_cmFindCommon).Makefile,&this->VariableName,value,
               &this->VariableDocumentation,this->VariableType,PVar3 == NEW);
    if (PVar4 != NEW) {
      return;
    }
    bVar2 = cmMakefile::IsNormalDefinitionSet
                      ((this->super_cmFindCommon).Makefile,&this->VariableName);
    if (!bVar2) {
      return;
    }
    pcVar1 = (this->super_cmFindCommon).Makefile;
    sVar6 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)value);
    cmMakefile::AddDefinition(pcVar1,&this->VariableName,sVar6);
    return;
  }
  cmStrCat<std::__cxx11::string&,char_const(&)[10]>
            ((string *)local_60,&this->VariableName,(char (*) [10])0x103ad0a);
  if ((this->StoreResultInCache & 1U) == 0) {
    pcVar1 = (this->super_cmFindCommon).Makefile;
    local_90 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    cmMakefile::AddDefinition(pcVar1,&this->VariableName,local_90);
  }
  else {
    cmMakefile::AddCacheDefinition
              ((this->super_cmFindCommon).Makefile,&this->VariableName,(string *)local_60,
               &this->VariableDocumentation,this->VariableType,PVar3 == NEW);
    if (PVar4 == NEW) {
      bVar2 = cmMakefile::IsNormalDefinitionSet
                        ((this->super_cmFindCommon).Makefile,&this->VariableName);
      if (bVar2) {
        pcVar1 = (this->super_cmFindCommon).Makefile;
        local_80 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
        cmMakefile::AddDefinition(pcVar1,&this->VariableName,local_80);
      }
    }
  }
  if ((this->Required & 1U) == 0) goto LAB_00a3d6de;
  pcVar1 = (this->super_cmFindCommon).Makefile;
  bVar2 = std::operator==(&this->FindCommandName,"find_file");
  if (bVar2) {
LAB_00a3d59f:
    local_168 = (char (*) [6])0x102a799;
  }
  else {
    bVar2 = std::operator==(&this->FindCommandName,"find_path");
    if (bVar2) goto LAB_00a3d59f;
    local_168 = (char (*) [6])0x10aec60;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e0,", ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f0);
  cmJoin(&local_d0,&this->Names,local_e0,local_f0);
  cmStrCat<char_const(&)[16],std::__cxx11::string&,char_const(&)[22],char_const(&)[6],char_const(&)[3],std::__cxx11::string>
            (&local_b0,(char (*) [16])"Could not find ",&this->VariableName,
             (char (*) [22])" using the following ",local_168,(char (*) [3])0x106ba8d,&local_d0);
  cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  cmSystemTools::SetFatalErrorOccurred();
LAB_00a3d6de:
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void cmFindBase::StoreFindResult(const std::string& value)
{
  bool force =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0125) == cmPolicies::NEW;
  bool updateNormalVariable =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0126) == cmPolicies::NEW;

  if (!value.empty()) {
    if (this->StoreResultInCache) {
      this->Makefile->AddCacheDefinition(this->VariableName, value,
                                         this->VariableDocumentation,
                                         this->VariableType, force);
      if (updateNormalVariable &&
          this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
        this->Makefile->AddDefinition(this->VariableName, value);
      }
    } else {
      this->Makefile->AddDefinition(this->VariableName, value);
    }

    return;
  }

  auto notFound = cmStrCat(this->VariableName, "-NOTFOUND");
  if (this->StoreResultInCache) {
    this->Makefile->AddCacheDefinition(this->VariableName, notFound,
                                       this->VariableDocumentation,
                                       this->VariableType, force);
    if (updateNormalVariable &&
        this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
      this->Makefile->AddDefinition(this->VariableName, notFound);
    }
  } else {
    this->Makefile->AddDefinition(this->VariableName, notFound);
  }

  if (this->Required) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Could not find ", this->VariableName, " using the following ",
               (this->FindCommandName == "find_file" ||
                    this->FindCommandName == "find_path"
                  ? "files"
                  : "names"),
               ": ", cmJoin(this->Names, ", ")));
    cmSystemTools::SetFatalErrorOccurred();
  }
}